

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O1

Int128 * __thiscall
clickhouse::ColumnDecimal::At(Int128 *__return_storage_ptr__,ColumnDecimal *this,size_t i)

{
  long lVar1;
  Type *pTVar2;
  Code CVar3;
  ColumnVector<int> *this_00;
  ColumnVector<long> *this_01;
  ColumnVector<absl::int128> *this_02;
  int *piVar4;
  long *plVar5;
  int128 *piVar6;
  Int128 *pIVar7;
  __weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  lVar1 = *(long *)((long)&__return_storage_ptr__[2].v_ + 8);
  pTVar2 = *(Type **)(lVar1 + 0x18);
  p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  CVar3 = Type::GetCode(pTVar2);
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  lVar1 = *(long *)((long)&__return_storage_ptr__[2].v_ + 8);
  if (CVar3 == Int32) {
    std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<clickhouse::Column,void>
              ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 8));
    if (local_30 == 0) {
      this_00 = (ColumnVector<int> *)0x0;
    }
    else {
      this_00 = (ColumnVector<int> *)
                __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<int>::typeinfo,0);
    }
    if (this_00 == (ColumnVector<int> *)0x0) {
      this_00 = (ColumnVector<int> *)0x0;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var8 = local_28;
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_28->_M_use_count = local_28->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_28->_M_use_count = local_28->_M_use_count + 1;
        }
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    piVar4 = ColumnVector<int>::At(this_00,(size_t)this);
    pIVar7 = (Int128 *)(long)*piVar4;
  }
  else {
    pTVar2 = *(Type **)(lVar1 + 0x18);
    p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    CVar3 = Type::GetCode(pTVar2);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    __r = (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
          (*(long *)((long)&__return_storage_ptr__[2].v_ + 8) + 8);
    if (CVar3 == Int64) {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,__r);
      if (local_30 == 0) {
        this_01 = (ColumnVector<long> *)0x0;
      }
      else {
        this_01 = (ColumnVector<long> *)
                  __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<long>::typeinfo,0);
      }
      if (this_01 == (ColumnVector<long> *)0x0) {
        this_01 = (ColumnVector<long> *)0x0;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var8 = local_28;
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_28->_M_use_count = local_28->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_28->_M_use_count = local_28->_M_use_count + 1;
          }
        }
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      plVar5 = ColumnVector<long>::At(this_01,(size_t)this);
      pIVar7 = (Int128 *)*plVar5;
    }
    else {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,__r);
      if (local_30 == 0) {
        this_02 = (ColumnVector<absl::int128> *)0x0;
      }
      else {
        this_02 = (ColumnVector<absl::int128> *)
                  __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<absl::int128>::typeinfo,0)
        ;
      }
      if (this_02 == (ColumnVector<absl::int128> *)0x0) {
        this_02 = (ColumnVector<absl::int128> *)0x0;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var8 = local_28;
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_28->_M_use_count = local_28->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_28->_M_use_count = local_28->_M_use_count + 1;
          }
        }
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      piVar6 = ColumnVector<absl::int128>::At(this_02,(size_t)this);
      pIVar7 = *(Int128 **)&piVar6->v_;
    }
  }
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  return pIVar7;
}

Assistant:

Int128 ColumnDecimal::At(size_t i) const {
    if (data_->Type()->GetCode() == Type::Int32) {
        return static_cast<Int128>(data_->As<ColumnInt32>()->At(i));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        return static_cast<Int128>(data_->As<ColumnInt64>()->At(i));
    } else {
        return data_->As<ColumnInt128>()->At(i);
    }
}